

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9GenSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vec_Wrd_t *pVVar4;
  char *pcVar5;
  uint local_40;
  int fVerbose;
  int fSatBased;
  int fDist;
  int nRare;
  int nWords;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fDist = 4;
  fSatBased = -1;
  bVar2 = false;
  bVar1 = false;
  local_40 = 0;
  Extra_UtilGetoptReset();
LAB_002a325d:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WRsdvh");
    if (iVar3 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9GenSim(): There is no AIG.\n");
        return 1;
      }
      iVar3 = Gia_ManRegNum(pAbc->pGia);
      if (iVar3 < 1) {
        if (bVar1) {
          if (pAbc->pGia->vSimsPi == (Vec_Wrd_t *)0x0) {
            Abc_Print(-1,
                      "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n");
            return 0;
          }
          Gia_ManPatSatImprove(pAbc->pGia,fDist,local_40);
        }
        else if (bVar2) {
          if (pAbc->pGia->vSimsPi == (Vec_Wrd_t *)0x0) {
            Abc_Print(-1,
                      "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n");
            return 0;
          }
          Gia_ManPatDistImprove(pAbc->pGia,local_40);
        }
        else if (fSatBased < 0) {
          Abc_Random(1);
          Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
          iVar3 = Gia_ManCiNum(pAbc->pGia);
          pVVar4 = Vec_WrdStartRandom(iVar3 * fDist);
          pAbc->pGia->vSimsPi = pVVar4;
          printf("Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n",
                 (ulong)(uint)(fDist << 6),(ulong)(uint)fDist);
        }
        else {
          if (pAbc->pGia->vSimsPi == (Vec_Wrd_t *)0x0) {
            Abc_Print(-1,
                      "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n");
            return 0;
          }
          Gia_ManPatRareImprove(pAbc->pGia,fSatBased,local_40);
        }
        Gia_ManSimProfile(pAbc->pGia);
        return 0;
      }
      Abc_Print(-1,"Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n");
      return 0;
    }
    switch(iVar3) {
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_002a357e;
      }
      fSatBased = atoi(argv[globalUtilOptind]);
      iVar3 = fSatBased;
      break;
    default:
      goto LAB_002a357e;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_002a357e;
      }
      fDist = atoi(argv[globalUtilOptind]);
      iVar3 = fDist;
      break;
    case 100:
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_002a325d;
    case 0x68:
      goto LAB_002a357e;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_002a325d;
    case 0x76:
      local_40 = local_40 ^ 1;
      goto LAB_002a325d;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 0) {
LAB_002a357e:
      Abc_Print(-2,"usage: &sim_gen [-WR num] [-sdvh]\n");
      Abc_Print(-2,"\t         generates random simulation patterns\n");
      Abc_Print(-2,"\t-W num : the number of 64-bit words of simulation info [default = %d]\n",
                (ulong)(uint)fDist);
      Abc_Print(-2,"\t-R num : the rarity parameter used to define scope [default = %d]\n",
                (ulong)(uint)fSatBased);
      pcVar5 = "no";
      if (bVar1) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,
                "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n"
                ,pcVar5);
      pcVar5 = "no";
      if (bVar2) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using one improvement of available patterns [default = %s]\n",
                pcVar5);
      pcVar5 = "no";
      if (local_40 != 0) {
        pcVar5 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GenSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSimProfile( Gia_Man_t * pGia );
    extern void Gia_ManPatSatImprove( Gia_Man_t * pGia, int nWords, int fVerbose );
    extern void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose );
    extern void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose );
    int c, nWords = 4, nRare = -1, fDist = 0, fSatBased = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRsdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRare = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRare < 0 )
                goto usage;
            break;
        case 's':
            fSatBased ^= 1;
            break;
        case 'd':
            fDist ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    if ( fSatBased )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatSatImprove( pAbc->pGia, nWords, fVerbose );
    }
    else if ( fDist )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatDistImprove( pAbc->pGia, fVerbose );
    }
    else if ( nRare >= 0 )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatRareImprove( pAbc->pGia, nRare, fVerbose );
    }
    else
    {
        Abc_Random(1);
        Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
        pAbc->pGia->vSimsPi = Vec_WrdStartRandom( Gia_ManCiNum(pAbc->pGia) * nWords );
        printf( "Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n", 64*nWords, nWords );
    }
    Gia_ManSimProfile( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_gen [-WR num] [-sdvh]\n" );
    Abc_Print( -2, "\t         generates random simulation patterns\n" );
    Abc_Print( -2, "\t-W num : the number of 64-bit words of simulation info [default = %d]\n",            nWords );
    Abc_Print( -2, "\t-R num : the rarity parameter used to define scope [default = %d]\n",                nRare );
    Abc_Print( -2, "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n", fSatBased? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using one improvement of available patterns [default = %s]\n",       fDist? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}